

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  Version *version;
  Session *this_local;
  
  poVar1 = cout();
  poVar1 = std::operator<<(poVar1,"\nCatch v");
  version = libraryVersion();
  poVar1 = Catch::operator<<(poVar1,version);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = clara::detail::operator<<(poVar1,&this->m_cli);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"For more detailed usage please see the project docs\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch v" << libraryVersion() << "\n"
                << m_cli << std::endl
                << "For more detailed usage please see the project docs\n" << std::endl;
    }